

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_CreateBlockMap(void)

{
  long lVar1;
  undefined1 auVar2 [16];
  TArray<int,_int> *pTVar3;
  TArray<int,_int> *pTVar4;
  int iVar5;
  int iVar6;
  int bmapwidth_00;
  int bmapheight_00;
  int iVar7;
  int iVar8;
  int c;
  int b;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  SDWORD SVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong *puVar19;
  TArray<int,_int> *this;
  int *piVar20;
  ulong uVar21;
  double dVar22;
  double dVar23;
  TArray<int,_int> *local_110;
  uint local_dc;
  uint ii;
  int stop_1;
  int xadd;
  int stop;
  int yadd;
  int yb;
  int xb;
  int ady;
  int adx;
  int ymove;
  int ychange;
  int xchange;
  int by2;
  int bx2;
  int by;
  int bx;
  int dy;
  int dx;
  int y2;
  int x2;
  int y1;
  int x1;
  undefined1 local_78 [8];
  TArray<int,_int> BlockMap;
  int line;
  int i;
  int maxy;
  int miny;
  int maxx;
  int minx;
  double dmaxy;
  double dminy;
  double dmaxx;
  double dminx;
  int bmapheight;
  int bmapwidth;
  int adder;
  TArray<int,_int> *endblock;
  TArray<int,_int> *block;
  TArray<int,_int> *BlockLists;
  
  if (0 < numvertexes) {
    dminy = vertex_t::fX(vertexes);
    _maxx = vertex_t::fY(vertexes);
    dmaxy = _maxx;
    dmaxx = dminy;
    for (BlockMap.Count = 1; (int)BlockMap.Count < numvertexes; BlockMap.Count = BlockMap.Count + 1)
    {
      dVar22 = vertex_t::fX(vertexes + (int)BlockMap.Count);
      if (dmaxx <= dVar22) {
        dVar22 = vertex_t::fX(vertexes + (int)BlockMap.Count);
        if (dminy < dVar22) {
          dminy = vertex_t::fX(vertexes + (int)BlockMap.Count);
        }
      }
      else {
        dmaxx = vertex_t::fX(vertexes + (int)BlockMap.Count);
      }
      dVar22 = vertex_t::fY(vertexes + (int)BlockMap.Count);
      if (dmaxy <= dVar22) {
        dVar22 = vertex_t::fY(vertexes + (int)BlockMap.Count);
        if (_maxx < dVar22) {
          _maxx = vertex_t::fY(vertexes + (int)BlockMap.Count);
        }
      }
      else {
        dmaxy = vertex_t::fY(vertexes + (int)BlockMap.Count);
      }
    }
    iVar5 = (int)dmaxx;
    iVar6 = (int)dmaxy;
    bmapwidth_00 = ((int)dminy - iVar5 >> 7) + 1;
    bmapheight_00 = ((int)_maxx - iVar6 >> 7) + 1;
    TArray<int,_int>::TArray((TArray<int,_int> *)local_78,bmapwidth_00 * bmapheight_00 * 3 + 4);
    bmapheight = iVar5;
    TArray<int,_int>::Push((TArray<int,_int> *)local_78,&bmapheight);
    bmapheight = iVar6;
    TArray<int,_int>::Push((TArray<int,_int> *)local_78,&bmapheight);
    bmapheight = bmapwidth_00;
    TArray<int,_int>::Push((TArray<int,_int> *)local_78,&bmapheight);
    bmapheight = bmapheight_00;
    TArray<int,_int>::Push((TArray<int,_int> *)local_78,&bmapheight);
    uVar17 = (ulong)(bmapwidth_00 * bmapheight_00);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar17;
    uVar18 = SUB168(auVar2 * ZEXT816(0x10),0);
    uVar21 = uVar18 + 8;
    if (0xfffffffffffffff7 < uVar18) {
      uVar21 = 0xffffffffffffffff;
    }
    if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
      uVar21 = 0xffffffffffffffff;
    }
    puVar19 = (ulong *)operator_new__(uVar21);
    *puVar19 = uVar17;
    block = (TArray<int,_int> *)(puVar19 + 1);
    if (uVar17 != 0) {
      local_110 = block;
      do {
        TArray<int,_int>::TArray(local_110);
        local_110 = local_110 + 1;
      } while (local_110 != block + uVar17);
    }
    for (BlockMap.Most = 0; (int)BlockMap.Most < numlines; BlockMap.Most = BlockMap.Most + 1) {
      dVar22 = vertex_t::fX(lines[(int)BlockMap.Most].v1);
      iVar7 = (int)dVar22;
      dVar22 = vertex_t::fY(lines[(int)BlockMap.Most].v1);
      iVar8 = (int)dVar22;
      dVar22 = vertex_t::fX(lines[(int)BlockMap.Most].v2);
      dVar23 = vertex_t::fY(lines[(int)BlockMap.Most].v2);
      c = (int)dVar22 - iVar7;
      b = (int)dVar23 - iVar8;
      bx2 = iVar7 - iVar5 >> 7;
      by2 = iVar8 - iVar6 >> 7;
      iVar9 = (int)dVar22 - iVar5 >> 7;
      iVar10 = (int)dVar23 - iVar6 >> 7;
      endblock = block + (bx2 + by2 * bmapwidth_00);
      _bmapwidth = block + (iVar9 + iVar10 * bmapwidth_00);
      if (endblock == _bmapwidth) {
        TArray<int,_int>::Push(endblock,(int *)&BlockMap.Most);
      }
      else if (by2 == iVar10) {
        if (iVar9 < bx2) {
          swapvalues<TArray<int,int>*>(&endblock,(TArray<int,_int> **)&bmapwidth);
        }
        do {
          TArray<int,_int>::Push(endblock,(int *)&BlockMap.Most);
          endblock = endblock + 1;
        } while (endblock <= _bmapwidth);
      }
      else if (bx2 == iVar9) {
        if (iVar10 < by2) {
          swapvalues<TArray<int,int>*>(&endblock,(TArray<int,_int> **)&bmapwidth);
        }
        do {
          TArray<int,_int>::Push(endblock,(int *)&BlockMap.Most);
          endblock = endblock + bmapwidth_00;
        } while (endblock <= _bmapwidth);
      }
      else {
        iVar11 = 1;
        if (c < 0) {
          iVar11 = -1;
        }
        iVar12 = 1;
        if (b < 0) {
          iVar12 = -1;
        }
        iVar13 = iVar12 * bmapwidth_00;
        xb = c;
        if (c < 1) {
          xb = -c;
        }
        iVar14 = b;
        if (b < 1) {
          iVar14 = -b;
        }
        if (xb == iVar14) {
          yadd = iVar7 - iVar5 & 0x7f;
          stop = iVar8 - iVar6 & 0x7f;
          if (c < 0) {
            yadd = 0x80 - yadd;
          }
          if (b < 0) {
            stop = 0x80 - stop;
          }
          if (yadd < stop) {
            xb = xb + -1;
          }
        }
        if (xb < iVar14) {
          iVar10 = 0x80;
          if (c < 0) {
            iVar10 = -1;
          }
          do {
            SVar15 = Scale(bx2 * 0x80 + iVar10 + (iVar5 - iVar7),b,c);
            for (; by2 != SVar15 + (iVar8 - iVar6) >> 7; by2 = iVar12 + by2) {
              TArray<int,_int>::Push(endblock,(int *)&BlockMap.Most);
              endblock = endblock + iVar13;
            }
            TArray<int,_int>::Push(endblock,(int *)&BlockMap.Most);
            endblock = endblock + iVar11;
            bx2 = iVar11 + bx2;
          } while (bx2 != iVar9);
          for (; endblock != _bmapwidth; endblock = endblock + iVar13) {
            TArray<int,_int>::Push(endblock,(int *)&BlockMap.Most);
          }
          TArray<int,_int>::Push(endblock,(int *)&BlockMap.Most);
        }
        else {
          iVar9 = 0x80;
          if (b < 0) {
            iVar9 = -1;
          }
          do {
            SVar15 = Scale(by2 * 0x80 + iVar9 + (iVar6 - iVar8),c,b);
            for (; bx2 != SVar15 + (iVar7 - iVar5) >> 7; bx2 = iVar11 + bx2) {
              TArray<int,_int>::Push(endblock,(int *)&BlockMap.Most);
              endblock = endblock + iVar11;
            }
            TArray<int,_int>::Push(endblock,(int *)&BlockMap.Most);
            endblock = endblock + iVar13;
            by2 = iVar12 + by2;
          } while (by2 != iVar10);
          for (; endblock != _bmapwidth; endblock = endblock + iVar11) {
            TArray<int,_int>::Push(endblock,(int *)&BlockMap.Most);
          }
          TArray<int,_int>::Push(endblock,(int *)&BlockMap.Most);
        }
      }
    }
    TArray<int,_int>::Reserve((TArray<int,_int> *)local_78,bmapwidth_00 * bmapheight_00);
    CreatePackedBlockmap((TArray<int,_int> *)local_78,block,bmapwidth_00,bmapheight_00);
    pTVar4 = block;
    if (block != (TArray<int,_int> *)0x0) {
      pTVar3 = block + -1;
      lVar1 = *(long *)&block[-1].Most;
      this = block + lVar1;
      while (pTVar4 != this) {
        this = this + -1;
        TArray<int,_int>::~TArray(this);
      }
      operator_delete__(&pTVar3->Most,lVar1 * 0x10 + 8);
    }
    uVar16 = TArray<int,_int>::Size((TArray<int,_int> *)local_78);
    blockmaplump = (int *)operator_new__((ulong)uVar16 << 2);
    for (local_dc = 0; uVar16 = TArray<int,_int>::Size((TArray<int,_int> *)local_78),
        local_dc < uVar16; local_dc = local_dc + 1) {
      piVar20 = TArray<int,_int>::operator[]((TArray<int,_int> *)local_78,(ulong)local_dc);
      blockmaplump[local_dc] = *piVar20;
    }
    TArray<int,_int>::~TArray((TArray<int,_int> *)local_78);
  }
  return;
}

Assistant:

static void P_CreateBlockMap ()
{
	TArray<int> *BlockLists, *block, *endblock;
	int adder;
	int bmapwidth, bmapheight;
	double dminx, dmaxx, dminy, dmaxy;
	int minx, maxx, miny, maxy;
	int i;
	int line;

	if (numvertexes <= 0)
		return;

	// Find map extents for the blockmap
	dminx = dmaxx = vertexes[0].fX();
	dminy = dmaxy = vertexes[0].fY();

	for (i = 1; i < numvertexes; ++i)
	{
			 if (vertexes[i].fX() < dminx) dminx = vertexes[i].fX();
		else if (vertexes[i].fX() > dmaxx) dmaxx = vertexes[i].fX();
			 if (vertexes[i].fY() < dminy) dminy = vertexes[i].fY();
		else if (vertexes[i].fY() > dmaxy) dmaxy = vertexes[i].fY();
	}

	minx = int(dminx);
	miny = int(dminy);
	maxx = int(dmaxx);
	maxy = int(dmaxy);

	bmapwidth =	 ((maxx - minx) >> BLOCKBITS) + 1;
	bmapheight = ((maxy - miny) >> BLOCKBITS) + 1;

	TArray<int> BlockMap (bmapwidth * bmapheight * 3 + 4);

	adder = minx;			BlockMap.Push (adder);
	adder = miny;			BlockMap.Push (adder);
	adder = bmapwidth;		BlockMap.Push (adder);
	adder = bmapheight;		BlockMap.Push (adder);

	BlockLists = new TArray<int>[bmapwidth * bmapheight];

	for (line = 0; line < numlines; ++line)
	{
		int x1 = int(lines[line].v1->fX());
		int y1 = int(lines[line].v1->fY());
		int x2 = int(lines[line].v2->fX());
		int y2 = int(lines[line].v2->fY());
		int dx = x2 - x1;
		int dy = y2 - y1;
		int bx = (x1 - minx) >> BLOCKBITS;
		int by = (y1 - miny) >> BLOCKBITS;
		int bx2 = (x2 - minx) >> BLOCKBITS;
		int by2 = (y2 - miny) >> BLOCKBITS;

		block = &BlockLists[bx + by * bmapwidth];
		endblock = &BlockLists[bx2 + by2 * bmapwidth];

		if (block == endblock)	// Single block
		{
			block->Push (line);
		}
		else if (by == by2)		// Horizontal line
		{
			if (bx > bx2)
			{
				swapvalues (block, endblock);
			}
			do
			{
				block->Push (line);
				block += 1;
			} while (block <= endblock);
		}
		else if (bx == bx2)	// Vertical line
		{
			if (by > by2)
			{
				swapvalues (block, endblock);
			}
			do
			{
				block->Push (line);
				block += bmapwidth;
			} while (block <= endblock);
		}
		else				// Diagonal line
		{
			int xchange = (dx < 0) ? -1 : 1;
			int ychange = (dy < 0) ? -1 : 1;
			int ymove = ychange * bmapwidth;
			int adx = abs (dx);
			int ady = abs (dy);

			if (adx == ady)		// 45 degrees
			{
				int xb = (x1 - minx) & (BLOCKSIZE-1);
				int yb = (y1 - miny) & (BLOCKSIZE-1);
				if (dx < 0)
				{
					xb = BLOCKSIZE-xb;
				}
				if (dy < 0)
				{
					yb = BLOCKSIZE-yb;
				}
				if (xb < yb)
					adx--;
			}
			if (adx >= ady)		// X-major
			{
				int yadd = dy < 0 ? -1 : BLOCKSIZE;
				do
				{
					int stop = (Scale ((by << BLOCKBITS) + yadd - (y1 - miny), dx, dy) + (x1 - minx)) >> BLOCKBITS;
					while (bx != stop)
					{
						block->Push (line);
						block += xchange;
						bx += xchange;
					}
					block->Push (line);
					block += ymove;
					by += ychange;
				} while (by != by2);
				while (block != endblock)
				{
					block->Push (line);
					block += xchange;
				}
				block->Push (line);
			}
			else					// Y-major
			{
				int xadd = dx < 0 ? -1 : BLOCKSIZE;
				do
				{
					int stop = (Scale ((bx << BLOCKBITS) + xadd - (x1 - minx), dy, dx) + (y1 - miny)) >> BLOCKBITS;
					while (by != stop)
					{
						block->Push (line);
						block += ymove;
						by += ychange;
					}
					block->Push (line);
					block += xchange;
					bx += xchange;
				} while (bx != bx2);
				while (block != endblock)
				{
					block->Push (line);
					block += ymove;
				}
				block->Push (line);
			}
		}
	}

	BlockMap.Reserve (bmapwidth * bmapheight);
	CreatePackedBlockmap (BlockMap, BlockLists, bmapwidth, bmapheight);
	delete[] BlockLists;

	blockmaplump = new int[BlockMap.Size()];
	for (unsigned int ii = 0; ii < BlockMap.Size(); ++ii)
	{
		blockmaplump[ii] = BlockMap[ii];
	}
}